

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom
          (EpsCopyInputStream *this,ZeroCopyInputStream *zcis)

{
  uint uVar1;
  EpsCopyInputStream *__dest;
  char *ptr_1;
  char *ptr;
  EpsCopyInputStream *pEStack_28;
  int size;
  void *data;
  ZeroCopyInputStream *zcis_local;
  EpsCopyInputStream *this_local;
  
  this->zcis_ = zcis;
  this->limit_ = 0x7fffffff;
  data = zcis;
  zcis_local = (ZeroCopyInputStream *)this;
  uVar1 = (*zcis->_vptr_ZeroCopyInputStream[2])(zcis,&stack0xffffffffffffffd8,(long)&ptr + 4);
  if ((uVar1 & 1) == 0) {
    this->overall_limit_ = 0;
    this->next_chunk_ = (char *)0x0;
    this->size_ = 0;
    this->buffer_end_ = this->patch_buffer_;
    this->limit_end_ = this->patch_buffer_;
    this_local = (EpsCopyInputStream *)this->patch_buffer_;
  }
  else {
    this->overall_limit_ = this->overall_limit_ - ptr._4_4_;
    if (ptr._4_4_ < 0x11) {
      this->buffer_end_ = this->patch_buffer_ + 0x10;
      this->limit_end_ = this->patch_buffer_ + 0x10;
      this->next_chunk_ = this->patch_buffer_;
      __dest = (EpsCopyInputStream *)((long)this + (0x48 - (long)ptr._4_4_));
      memcpy(__dest,pEStack_28,(long)ptr._4_4_);
      this_local = __dest;
    }
    else {
      this->limit_ = this->limit_ - (ptr._4_4_ + -0x10);
      this->buffer_end_ = pEStack_28->patch_buffer_ + (long)ptr._4_4_ + -0x38;
      this->limit_end_ = pEStack_28->patch_buffer_ + (long)ptr._4_4_ + -0x38;
      this->next_chunk_ = this->patch_buffer_;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
      this_local = pEStack_28;
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::InitFrom(io::ZeroCopyInputStream* zcis) {
  zcis_ = zcis;
  const void* data;
  int size;
  limit_ = INT_MAX;
  if (zcis->Next(&data, &size)) {
    overall_limit_ -= size;
    if (size > kSlopBytes) {
      auto ptr = static_cast<const char*>(data);
      limit_ -= size - kSlopBytes;
      limit_end_ = buffer_end_ = ptr + size - kSlopBytes;
      next_chunk_ = patch_buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return ptr;
    } else {
      limit_end_ = buffer_end_ = patch_buffer_ + kSlopBytes;
      next_chunk_ = patch_buffer_;
      auto ptr = patch_buffer_ + kPatchBufferSize - size;
      std::memcpy(ptr, data, size);
      return ptr;
    }
  }
  overall_limit_ = 0;
  next_chunk_ = nullptr;
  size_ = 0;
  limit_end_ = buffer_end_ = patch_buffer_;
  return patch_buffer_;
}